

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_av.c
# Opt level: O2

dtl_av_t * dtl_av_make(dtl_dv_t **ppValue,int32_t s32Len)

{
  dtl_av_t *self;
  ulong uVar1;
  
  if (-1 < s32Len) {
    self = dtl_av_new();
    if (self != (dtl_av_t *)0x0) {
      dtl_av_extend(self,s32Len);
      for (uVar1 = 0; (uint)s32Len != uVar1; uVar1 = uVar1 + 1) {
        dtl_av_set(self,(int32_t)uVar1,ppValue[uVar1]);
      }
      return self;
    }
  }
  return (dtl_av_t *)0x0;
}

Assistant:

dtl_av_t* dtl_av_make(dtl_dv_t** ppValue, int32_t s32Len){
   if(s32Len<0){
      return (dtl_av_t*)0;
   }
   dtl_av_t *self = dtl_av_new();
   if(self){
      int32_t s32i;
      dtl_av_extend(self,s32Len);
      for(s32i=0;s32i<s32Len;s32i++){
         dtl_av_set(self,s32i,ppValue[s32i]);
      }
   }
   return self;
}